

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O1

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetModuleOrDeviceList
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,size_t numberOfDevices
          ,SINGLYLINKEDLIST_HANDLE deviceOrModuleList,IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type,
          int struct_version)

{
  IOTHUB_REGISTRYMANAGER_RESULT IVar1;
  JSON_Status JVar2;
  LOGGER_LOG p_Var3;
  BUFFER_HANDLE responseBuffer;
  uchar *puVar4;
  JSON_Value *value;
  JSON_Array *array;
  size_t sVar5;
  JSON_Object *root_object;
  undefined8 *item;
  LIST_ITEM_HANDLE pLVar6;
  IOTHUB_MODULE *pIVar7;
  LIST_ITEM_HANDLE pLVar8;
  int iVar9;
  char *pcVar10;
  IOTHUB_MODULE *moduleInfo;
  size_t index;
  bool bVar11;
  IOTHUB_DEVICE_OR_MODULE local_d0;
  
  if (registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0 ||
      deviceOrModuleList == (SINGLYLINKEDLIST_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar10 = "Input parameter cannot be NULL";
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    iVar9 = 0x718;
LAB_00138b0d:
    (*p_Var3)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
              ,"IoTHubRegistryManager_GetModuleOrDeviceList",iVar9,1,pcVar10);
    return IVar1;
  }
  if (numberOfDevices - 0x3e9 < 0xfffffffffffffc18) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar10 = "numberOfDevices has to be between 1 and 1000";
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    iVar9 = 0x71d;
    goto LAB_00138b0d;
  }
  if (struct_version != 1 && struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE) {
    p_Var3 = xlogging_get_log_function();
    IVar1 = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    pcVar10 = "Invalid module version";
    iVar9 = 0x722;
    goto LAB_00138b0d;
  }
  responseBuffer = BUFFER_new();
  if (responseBuffer == (BUFFER_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00138b67;
    pcVar10 = "BUFFER_new failed for responseBuffer";
    iVar9 = 0x72b;
  }
  else {
    IVar1 = sendHttpRequestCRUD(registryManagerHandle,IOTHUB_REQUEST_GET_DEVICE_LIST,deviceId,
                                (char *)0x0,(BUFFER_HANDLE)0x0,numberOfDevices,responseBuffer);
    if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
      puVar4 = BUFFER_u_char(responseBuffer);
      if (puVar4 == (uchar *)0x0) {
        p_Var3 = xlogging_get_log_function();
        IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
        if (p_Var3 != (LOGGER_LOG)0x0) {
          pcVar10 = "BUFFER_u_char failed";
          iVar9 = 0x350;
LAB_00138fe9:
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"parseDeviceOrModuleListJson",iVar9,1,pcVar10);
        }
LAB_00138ff9:
        array = (JSON_Array *)0x0;
        value = (JSON_Value *)0x0;
      }
      else {
        value = json_parse_string((char *)0x138b93);
        if (value == (JSON_Value *)0x0) {
          p_Var3 = xlogging_get_log_function();
          IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
          if (p_Var3 != (LOGGER_LOG)0x0) {
            pcVar10 = "json_parse_string failed";
            iVar9 = 0x355;
            goto LAB_00138fe9;
          }
          goto LAB_00138ff9;
        }
        array = json_value_get_array(value);
        if (array == (JSON_Array *)0x0) {
          p_Var3 = xlogging_get_log_function();
          IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
          if (p_Var3 == (LOGGER_LOG)0x0) {
            array = (JSON_Array *)0x0;
          }
          else {
            array = (JSON_Array *)0x0;
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                      ,"parseDeviceOrModuleListJson",0x35a,1,"json_value_get_object failed");
          }
        }
        else {
          sVar5 = json_array_get_count(array);
          if (sVar5 == 0) {
            IVar1 = IOTHUB_REGISTRYMANAGER_OK;
          }
          else {
            index = 0;
            do {
              root_object = json_array_get_object(array,index);
              if (root_object == (JSON_Object *)0x0) {
                p_Var3 = xlogging_get_log_function();
                IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"parseDeviceOrModuleListJson",0x369,1,"json_array_get_object failed");
                }
              }
              else {
                memset(&local_d0,0,0xa0);
                local_d0.connectionState = IOTHUB_DEVICE_CONNECTION_STATE_DISCONNECTED;
                local_d0.status = IOTHUB_DEVICE_STATUS_DISABLED;
                IVar1 = parseDeviceOrModuleJsonObject(root_object,&local_d0);
                if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
                  if (struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE) {
                    item = (undefined8 *)malloc(0x88);
                    if (item == (undefined8 *)0x0) {
                      p_Var3 = xlogging_get_log_function();
                      IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                  ,"addDeviceOrModuleToLinkedListAsDevice",0x303,1,
                                  "Malloc failed for device");
                      }
LAB_00138ecb:
                      bVar11 = false;
                    }
                    else {
                      *item = local_d0.deviceId;
                      item[1] = local_d0.primaryKey;
                      item[2] = local_d0.secondaryKey;
                      item[3] = local_d0.generationId;
                      item[4] = local_d0.eTag;
                      *(IOTHUB_DEVICE_CONNECTION_STATE *)(item + 5) = local_d0.connectionState;
                      item[6] = local_d0.connectionStateUpdatedTime;
                      *(IOTHUB_DEVICE_STATUS *)(item + 7) = local_d0.status;
                      item[8] = local_d0.statusReason;
                      item[9] = local_d0.statusUpdatedTime;
                      item[10] = local_d0.lastActivityTime;
                      item[0xb] = local_d0.cloudToDeviceMessageCount;
                      *(_Bool *)(item + 0xc) = local_d0.isManaged;
                      item[0xd] = local_d0.configuration;
                      item[0xe] = local_d0.deviceProperties;
                      item[0xf] = local_d0.serviceProperties;
                      *(IOTHUB_REGISTRYMANAGER_AUTH_METHOD *)(item + 0x10) = local_d0.authMethod;
                      pLVar6 = singlylinkedlist_add(deviceOrModuleList,item);
                      if (pLVar6 == (LIST_ITEM_HANDLE)0x0) {
                        p_Var3 = xlogging_get_log_function();
                        if (p_Var3 != (LOGGER_LOG)0x0) {
                          (*p_Var3)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                    ,"addDeviceOrModuleToLinkedListAsDevice",0x30d,1,
                                    "singlylinkedlist_add failed");
                        }
                        free(item);
                        IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                        goto LAB_00138ecb;
                      }
                      IVar1 = IOTHUB_REGISTRYMANAGER_OK;
                      bVar11 = true;
                    }
                    if (bVar11) {
                      free(local_d0.moduleId);
                      IVar1 = IOTHUB_REGISTRYMANAGER_OK;
                      local_d0.moduleId = (char *)0x0;
                      free(local_d0.managedBy);
                      local_d0.managedBy = (char *)0x0;
                    }
                  }
                  else {
                    pIVar7 = (IOTHUB_MODULE *)malloc(0xa0);
                    if (pIVar7 == (IOTHUB_MODULE *)0x0) {
                      p_Var3 = xlogging_get_log_function();
                      IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
                      if (p_Var3 != (LOGGER_LOG)0x0) {
                        (*p_Var3)(AZ_LOG_ERROR,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                  ,"addDeviceOrModuleToLinkedListAsModule",0x321,1,
                                  "Malloc failed for module");
                      }
                    }
                    else {
                      pIVar7->version = struct_version;
                      move_deviceOrModule_members_to_module(&local_d0,pIVar7);
                      pLVar6 = singlylinkedlist_add(deviceOrModuleList,pIVar7);
                      IVar1 = IOTHUB_REGISTRYMANAGER_OK;
                      if (pLVar6 == (LIST_ITEM_HANDLE)0x0) {
                        p_Var3 = xlogging_get_log_function();
                        if (p_Var3 != (LOGGER_LOG)0x0) {
                          (*p_Var3)(AZ_LOG_ERROR,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                                    ,"addDeviceOrModuleToLinkedListAsModule",0x32c,1,
                                    "singlylinkedlist_add failed");
                        }
                        free(pIVar7);
                        IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                      }
                    }
                  }
                  if (IVar1 == IOTHUB_REGISTRYMANAGER_OK) {
                    IVar1 = IOTHUB_REGISTRYMANAGER_OK;
                  }
                  else {
                    free_deviceOrModule_members(&local_d0);
                  }
                }
                else {
                  free_deviceOrModule_members(&local_d0);
                }
              }
              if ((root_object != (JSON_Object *)0x0) &&
                 (JVar2 = json_object_clear(root_object), JVar2 != 0)) {
                p_Var3 = xlogging_get_log_function();
                IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
                if (p_Var3 != (LOGGER_LOG)0x0) {
                  (*p_Var3)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                            ,"parseDeviceOrModuleListJson",0x38e,1,"json_object_clear failed");
                }
              }
            } while ((IVar1 == IOTHUB_REGISTRYMANAGER_OK) &&
                    (bVar11 = sVar5 - 1 != index, index = index + 1, bVar11));
          }
        }
      }
      if ((array != (JSON_Array *)0x0) && (JVar2 = json_array_clear(array), JVar2 != 0)) {
        p_Var3 = xlogging_get_log_function();
        IVar1 = IOTHUB_REGISTRYMANAGER_JSON_ERROR;
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
                    ,"parseDeviceOrModuleListJson",0x39c,1,"json_array_clear failed");
        }
      }
      if (value != (JSON_Value *)0x0) {
        json_value_free(value);
      }
      if (IVar1 != IOTHUB_REGISTRYMANAGER_OK) {
        pLVar6 = singlylinkedlist_get_head_item(deviceOrModuleList);
        while (pLVar6 != (LIST_ITEM_HANDLE)0x0) {
          pIVar7 = (IOTHUB_MODULE *)singlylinkedlist_item_get_value(pLVar6);
          if (struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_DEVICE) {
            free(*(void **)pIVar7);
            free(pIVar7->deviceId);
            free(pIVar7->primaryKey);
            free(pIVar7->secondaryKey);
            free(pIVar7->generationId);
            free(*(void **)&pIVar7->connectionState);
            free(*(void **)&pIVar7->status);
            free(pIVar7->statusReason);
            free(pIVar7->statusUpdatedTime);
            free(*(void **)&pIVar7->isManaged);
            free(pIVar7->configuration);
            free(pIVar7->deviceProperties);
            memset(pIVar7,0,0x88);
          }
          else {
            IoTHubRegistryManager_FreeModuleMembers(pIVar7);
          }
          free(pIVar7);
          pLVar8 = singlylinkedlist_get_next_item(pLVar6);
          singlylinkedlist_remove(deviceOrModuleList,pLVar6);
          pLVar6 = pLVar8;
        }
      }
      goto LAB_00138b67;
    }
    if (IVar1 != IOTHUB_REGISTRYMANAGER_ERROR) goto LAB_00138b67;
    p_Var3 = xlogging_get_log_function();
    IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
    if (p_Var3 == (LOGGER_LOG)0x0) goto LAB_00138b67;
    pcVar10 = "Failure sending HTTP request for get device list";
    iVar9 = 0x730;
  }
  IVar1 = IOTHUB_REGISTRYMANAGER_ERROR;
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
            ,"IoTHubRegistryManager_GetModuleOrDeviceList",iVar9,1,pcVar10);
LAB_00138b67:
  if (responseBuffer != (BUFFER_HANDLE)0x0) {
    BUFFER_delete(responseBuffer);
    return IVar1;
  }
  return IVar1;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetModuleOrDeviceList(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, size_t numberOfDevices, SINGLYLINKEDLIST_HANDLE deviceOrModuleList, IOTHUB_REGISTRYMANAGER_MODEL_TYPE struct_type, int struct_version)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceOrModuleList == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((numberOfDevices == 0) || (numberOfDevices > IOTHUB_DEVICES_MAX_REQUEST))
    {
        LogError("numberOfDevices has to be between 1 and 1000");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if ((struct_type == IOTHUB_REGISTRYMANAGER_MODEL_TYPE_MODULE) && ((struct_version < IOTHUB_MODULE_VERSION_1) || (struct_version > IOTHUB_MODULE_VERSION_LATEST)))
    {
        LogError("Invalid module version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        BUFFER_HANDLE responseBuffer = NULL;

        if ((responseBuffer = BUFFER_new()) == NULL)
        {
            LogError("BUFFER_new failed for responseBuffer");
            result = IOTHUB_REGISTRYMANAGER_ERROR;
        }
        else if ((result = sendHttpRequestCRUD(registryManagerHandle, IOTHUB_REQUEST_GET_DEVICE_LIST, deviceId, NULL, NULL, numberOfDevices, responseBuffer)) == IOTHUB_REGISTRYMANAGER_ERROR)
        {
            LogError("Failure sending HTTP request for get device list");
        }
        else if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            result = parseDeviceOrModuleListJson(responseBuffer, deviceOrModuleList, struct_type, struct_version);
        }

        if (responseBuffer != NULL)
        {
            BUFFER_delete(responseBuffer);
        }
    }
    return result;
}